

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void av1_gop_bit_allocation
               (AV1_COMP *cpi,RATE_CONTROL *rc,GF_GROUP *gf_group,int is_key_frame,int use_arf,
               int64_t gf_group_bits)

{
  long in_RSI;
  long *in_RDI;
  int64_t in_R9;
  int unaff_retaddr;
  RATE_CONTROL *in_stack_00000008;
  AV1_COMP *in_stack_00000010;
  int gf_arf_bits;
  PRIMARY_RATE_CONTROL *p_rc;
  int in_stack_00000050;
  int in_stack_00000054;
  int64_t in_stack_00000058;
  RATE_CONTROL *in_stack_00000060;
  PRIMARY_RATE_CONTROL *in_stack_00000068;
  GF_GROUP *in_stack_00000070;
  int in_stack_00000080;
  
  calculate_boost_bits
            (*(int *)(*in_RDI + 0xac60) - (uint)(*(int *)(in_RSI + 0x30) == 0),
             *(int *)(*in_RDI + 0x8b3c),in_R9);
  adjust_boost_bits_for_target_level
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(int64_t)in_RDI,
             (int)((ulong)in_RSI >> 0x20));
  allocate_gf_group_bits
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
             in_stack_00000054,in_stack_00000050,in_stack_00000080);
  return;
}

Assistant:

static void av1_gop_bit_allocation(const AV1_COMP *cpi, RATE_CONTROL *const rc,
                                   GF_GROUP *gf_group, int is_key_frame,
                                   int use_arf, int64_t gf_group_bits) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  // Calculate the extra bits to be used for boosted frame(s)
#ifdef FIXED_ARF_BITS
  int gf_arf_bits = (int)(ARF_BITS_FRACTION * gf_group_bits);
#else
  int gf_arf_bits = calculate_boost_bits(
      p_rc->baseline_gf_interval - (rc->frames_since_key == 0), p_rc->gfu_boost,
      gf_group_bits);
#endif

  gf_arf_bits = adjust_boost_bits_for_target_level(cpi, rc, gf_arf_bits,
                                                   gf_group_bits, 1);

  // Allocate bits to each of the frames in the GF group.
  allocate_gf_group_bits(gf_group, p_rc, rc, gf_group_bits, gf_arf_bits,
                         is_key_frame, use_arf);
}